

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04a.cpp
# Opt level: O3

bool day4a::is_real_room(string *name,string *checksum)

{
  char *pcVar1;
  char cVar2;
  undefined2 uVar3;
  size_type sVar4;
  pointer pcVar5;
  ulong uVar6;
  char *pcVar7;
  size_type sVar8;
  char cVar9;
  char cVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  array<std::pair<char,_char>,_26UL> letters;
  char acStack_10a [186];
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  undefined1 local_14 [4];
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_18 = 0;
  sVar4 = name->_M_string_length;
  if (sVar4 != 0) {
    pcVar5 = (name->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      cVar2 = pcVar5[sVar8];
      lVar11 = (long)cVar2;
      if (lVar11 != 0x2d) {
        acStack_10a[lVar11 * 2] = cVar2;
        acStack_10a[lVar11 * 2 + 1] = acStack_10a[lVar11 * 2 + 1] + '\x01';
      }
      sVar8 = sVar8 + 1;
    } while (sVar4 != sVar8);
  }
  uStack_50 = 0x1089e4;
  std::
  __introsort_loop<std::pair<char,char>*,long,__gnu_cxx::__ops::_Iter_comp_iter<day4a::is_real_room(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>>
            (&local_48,local_14,8);
  uVar6 = 2;
  pcVar7 = (char *)((long)&local_48 + 3);
  lVar11 = 2;
  pcVar12 = (char *)&local_48;
  do {
    pcVar1 = (char *)((long)&local_48 + lVar11);
    if ((local_48._1_1_ < pcVar12[3]) ||
       ((pcVar12[3] == local_48._1_1_ && (*pcVar1 < (char)local_48)))) {
      uVar3 = *(undefined2 *)pcVar1;
      uVar13 = uVar6;
      do {
        *(undefined2 *)((long)&uStack_50 + uVar13 * 2 + 6) =
             *(undefined2 *)((long)&uStack_50 + uVar13 * 2 + 4);
        uVar13 = uVar13 - 1;
      } while (1 < uVar13);
      local_48 = CONCAT62(local_48._2_6_,uVar3);
    }
    else {
      uVar3 = *(undefined2 *)pcVar1;
      pcVar12 = pcVar7;
      while( true ) {
        cVar2 = pcVar12[-2];
        cVar10 = (char)((ushort)uVar3 >> 8);
        if ((cVar10 <= cVar2) && ((cVar9 = (char)uVar3, cVar2 != cVar10 || (pcVar12[-3] <= cVar9))))
        break;
        pcVar12[-1] = pcVar12[-3];
        *pcVar12 = cVar2;
        pcVar12 = pcVar12 + -2;
      }
      pcVar12[-1] = cVar9;
      *pcVar12 = cVar10;
    }
    lVar11 = lVar11 + 2;
    pcVar7 = pcVar7 + 2;
    uVar6 = uVar6 + 1;
    pcVar12 = pcVar1;
  } while (lVar11 != 0x20);
  lVar11 = 0x20;
  pcVar7 = (char *)((long)&local_28 + 1);
  do {
    uVar3 = *(undefined2 *)((long)&local_48 + lVar11);
    pcVar12 = pcVar7;
    while( true ) {
      cVar2 = pcVar12[-2];
      cVar10 = (char)((ushort)uVar3 >> 8);
      if ((cVar10 <= cVar2) && ((cVar9 = (char)uVar3, cVar2 != cVar10 || (pcVar12[-3] <= cVar9))))
      break;
      pcVar12[-1] = pcVar12[-3];
      *pcVar12 = cVar2;
      pcVar12 = pcVar12 + -2;
    }
    pcVar12[-1] = cVar9;
    *pcVar12 = cVar10;
    lVar11 = lVar11 + 2;
    pcVar7 = pcVar7 + 2;
  } while (lVar11 != 0x34);
  pcVar7 = (checksum->_M_dataplus)._M_p;
  if ((char)local_48 == *pcVar7) {
    uVar6 = 0;
    do {
      uVar13 = uVar6;
      if (uVar13 == 4) break;
      uVar6 = uVar13 + 1;
    } while (*(char *)((long)&local_48 + uVar13 * 2 + 2) == pcVar7[uVar13 + 1]);
    bVar14 = 3 < uVar13;
  }
  else {
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool is_real_room(const std::string& name, const std::string& checksum) {
		std::array<std::pair<char, char>, 26> letters;
		for(auto c : name) {
			if(c == '-') {
				continue;
			}
			auto& l = letters[c - 'a'];
			l.first = c;
			l.second++;
		}
		std::sort(letters.begin(), letters.end(), [](const auto& a, const auto& b) {
			return a.second > b.second || (a.second == b.second && a.first < b.first);
		});
		for(int i = 0; i < 5; ++i) {
			if(letters[i].first != checksum[i]) {
				return false;
			}
		}
		return true;
	}